

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcSizeAfterConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_68;
  float local_64;
  undefined1 local_58 [8];
  ImGuiSizeCallbackData data;
  ImRect cr;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImVec2 new_size_local;
  
  pIVar2 = GImGui;
  window_local = (ImGuiWindow *)new_size;
  if ((GImGui->NextWindowData).SizeConstraintCond != 0) {
    data.DesiredSize = (GImGui->NextWindowData).SizeConstraintRect.Min;
    IVar1 = (GImGui->NextWindowData).SizeConstraintRect.Max;
    if ((data.DesiredSize.x < 0.0) || (cr.Min.x = IVar1.x, cr.Min.x < 0.0)) {
      local_64 = (window->SizeFull).x;
    }
    else {
      window_local._0_4_ = new_size.x;
      fVar6 = window_local._0_4_;
      local_64 = ImClamp<float>(fVar6,data.DesiredSize.x,cr.Min.x);
    }
    window_local = (ImGuiWindow *)CONCAT44(window_local._4_4_,local_64);
    if ((data.DesiredSize.y < 0.0) || (cr.Min.y = IVar1.y, cr.Min.y < 0.0)) {
      local_68 = (window->SizeFull).y;
    }
    else {
      local_68 = ImClamp<float>(window_local._4_4_,data.DesiredSize.y,cr.Min.y);
    }
    window_local = (ImGuiWindow *)CONCAT44(local_68,window_local._0_4_);
    if ((pIVar2->NextWindowData).SizeCallback != (ImGuiSizeCallback)0x0) {
      ImGuiSizeCallbackData::ImGuiSizeCallbackData((ImGuiSizeCallbackData *)local_58);
      local_58 = (undefined1  [8])(pIVar2->NextWindowData).SizeCallbackUserData;
      data.UserData = *(void **)&window->Pos;
      data.Pos = window->SizeFull;
      data.CurrentSize = (ImVec2)window_local;
      (*(pIVar2->NextWindowData).SizeCallback)((ImGuiSizeCallbackData *)local_58);
      window_local = (ImGuiWindow *)data.CurrentSize;
    }
  }
  if ((window->Flags & 0x1000040U) == 0) {
    window_local = (ImGuiWindow *)ImMax((ImVec2 *)&window_local,&(pIVar2->Style).WindowMinSize);
    fVar6 = window_local._4_4_;
    fVar3 = ImGuiWindow::TitleBarHeight(window);
    fVar4 = ImGuiWindow::MenuBarHeight(window);
    fVar5 = ImMax<float>(0.0,(pIVar2->Style).WindowRounding - 1.0);
    fVar6 = ImMax<float>(fVar6,fVar3 + fVar4 + fVar5);
    window_local = (ImGuiWindow *)CONCAT44(fVar6,window_local._0_4_);
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcSizeAfterConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.NextWindowData.SizeConstraintCond != 0)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window->TitleBarHeight() + window->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}